

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O1

attributes_t * __thiscall
tchecker::parsing::system::parser_t::value_type::as<tchecker::parsing::attributes_t>
          (value_type *this)

{
  char *__s1;
  int iVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.hh"
                  ,0x14f,
                  "const T &tchecker::parsing::system::parser_t::value_type::as() const [T = tchecker::parsing::attributes_t]"
                 );
  }
  __s1 = *(char **)(this->yytypeid_ + 8);
  if (__s1 == "N8tchecker7parsing12attributes_tE") {
    return (attributes_t *)this;
  }
  if ((*__s1 != '*') && (iVar1 = strcmp(__s1,"N8tchecker7parsing12attributes_tE"), iVar1 == 0)) {
    return (attributes_t *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.hh"
                ,0x150,
                "const T &tchecker::parsing::system::parser_t::value_type::as() const [T = tchecker::parsing::attributes_t]"
               );
}

Assistant:

const T&
    as () const YY_NOEXCEPT
    {
      SPYY_ASSERT (yytypeid_);
      SPYY_ASSERT (*yytypeid_ == typeid (T));
      SPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }